

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

int __thiscall luna::Function::SearchUpvalue(Function *this,String *name)

{
  size_type sVar1;
  const_reference pvVar2;
  String *in_RSI;
  long in_RDI;
  int i;
  int size;
  int local_20;
  
  sVar1 = std::vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>::
          size((vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_> *)
               (in_RDI + 0x90));
  local_20 = 0;
  while( true ) {
    if ((int)sVar1 <= local_20) {
      return -1;
    }
    pvVar2 = std::vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
             ::operator[]((vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
                           *)(in_RDI + 0x90),(long)local_20);
    if (pvVar2->name_ == in_RSI) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

int Function::SearchUpvalue(String *name) const
    {
        int size = upvalues_.size();
        for (int i = 0; i < size; ++i)
        {
            if (upvalues_[i].name_ == name)
                return i;
        }

        return -1;
    }